

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::makeArraySizeId
          (TGlslangToSpvTraverser *this,TArraySizes *arraySizes,int dim,bool allowZero,bool boolType
          )

{
  bool bVar1;
  int iVar2;
  Id IVar3;
  uint value;
  TIntermTyped *pTVar4;
  undefined4 extraout_var;
  TType *type;
  Builder *this_00;
  
  pTVar4 = glslang::TSmallArrayVector::getDimNode(&arraySizes->sizes,dim);
  if (pTVar4 != (TIntermTyped *)0x0) {
    spv::Builder::clearAccessChain(&this->builder);
    bVar1 = (this->builder).generatingOpCodeForSpecConst;
    (this->builder).generatingOpCodeForSpecConst = true;
    (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,this);
    iVar2 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[3])(pTVar4);
    type = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))
                              ((long *)CONCAT44(extraout_var,iVar2));
    IVar3 = accessChainLoad(this,type);
    if (bVar1 == true) {
      (this->builder).generatingOpCodeForSpecConst = true;
    }
    else {
      (this->builder).generatingOpCodeForSpecConst = false;
    }
    return IVar3;
  }
  value = glslang::TSmallArrayVector::getDimSize(&arraySizes->sizes,dim);
  if (0 < (int)value || allowZero) {
    this_00 = &this->builder;
    if (boolType) {
      IVar3 = spv::Builder::makeBoolConstant(this_00,value != 0,false);
      return IVar3;
    }
    IVar3 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar3 = spv::Builder::makeIntConstant(this_00,IVar3,value,false);
    return IVar3;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                ,0x1606,
                "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::makeArraySizeId(const glslang::TArraySizes &, int, bool, bool)"
               );
}

Assistant:

spv::Id TGlslangToSpvTraverser::makeArraySizeId(const glslang::TArraySizes& arraySizes, int dim, bool allowZero, bool boolType)
{
    // First, see if this is sized with a node, meaning a specialization constant:
    glslang::TIntermTyped* specNode = arraySizes.getDimNode(dim);
    if (specNode != nullptr) {
        builder.clearAccessChain();
        SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
        specNode->traverse(this);
        return accessChainLoad(specNode->getAsTyped()->getType());
    }

    // Otherwise, need a compile-time (front end) size, get it:
    int size = arraySizes.getDimSize(dim);

    if (!allowZero)
        assert(size > 0);

    if (boolType) {
        return builder.makeBoolConstant(size);
    } else {
        return builder.makeUintConstant(size);
    }
}